

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  uint in_EDX;
  ImGuiWindow *in_RSI;
  float fVar3;
  float fVar4;
  bool ret;
  ImGuiWindowFlags window_flags;
  ImVec2 pos;
  ImRect r_outer;
  ImVec2 size_expected;
  ImGuiWindow *popup_window;
  char name [16];
  int popup_max_height_in_items;
  ImU32 text_col;
  ImU32 bg_col;
  float value_x2;
  ImU32 frame_col;
  bool popup_open;
  bool pressed;
  bool held;
  bool hovered;
  ImRect total_bb;
  ImRect frame_bb;
  float w;
  float expected_w;
  ImVec2 label_size;
  float arrow_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiWindow *window;
  bool has_window_size_constraint;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_00000264;
  bool *in_stack_00000268;
  char *in_stack_00000270;
  ImRect *in_stack_fffffffffffffe18;
  ImRect *in_stack_fffffffffffffe20;
  ImGuiWindow *in_stack_fffffffffffffe28;
  ImDrawList *in_stack_fffffffffffffe30;
  int count;
  ImDrawList *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined3 uVar5;
  ImGuiID in_stack_fffffffffffffe44;
  ImDrawList *in_stack_fffffffffffffe48;
  ImRect *in_stack_fffffffffffffe50;
  ImGuiStyleVar idx;
  ImVec2 *this;
  undefined1 hide_text_after_hash;
  undefined4 in_stack_fffffffffffffe60;
  ImRect *bb;
  ImVec2 pos_00;
  ImVec2 p_max;
  ImVec2 p_min;
  float local_178;
  float local_174;
  ImVec2 local_16c;
  undefined4 local_164;
  ImVec2 local_160;
  ImVec2 local_158;
  ImVec2 local_150;
  ImRect local_148;
  undefined8 in_stack_fffffffffffffec8;
  ImRect *in_stack_fffffffffffffed0;
  char local_128 [12];
  ImGuiPopupPositionPolicy in_stack_fffffffffffffee4;
  ImRect *in_stack_fffffffffffffee8;
  ImRect *in_stack_fffffffffffffef0;
  ImGuiDir *in_stack_fffffffffffffef8;
  float in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  ImVec2 in_stack_ffffffffffffff08;
  ImVec2 local_f0;
  float in_stack_ffffffffffffff1c;
  undefined8 in_stack_ffffffffffffff20;
  ImDrawList *in_stack_ffffffffffffff28;
  ImVec2 in_stack_ffffffffffffff30;
  ImVec2 local_c4;
  ImVec2 local_bc;
  ImU32 local_b4;
  ImU32 local_b0;
  ImVec2 local_ac;
  float local_a4;
  ImU32 local_a0;
  byte local_9c;
  byte local_9b;
  undefined1 local_99;
  ImVec2 local_98;
  ImVec2 local_90;
  ImRect local_88;
  ImRect local_78;
  ImRect local_68;
  float local_58;
  float local_54;
  ImVec2 local_50;
  float local_48;
  ImGuiID local_44;
  ImGuiStyle *local_40;
  ImGuiWindow *local_38;
  byte local_29;
  ImGuiContext *local_28;
  uint local_1c;
  ImGuiWindow *local_18;
  bool local_1;
  
  local_28 = GImGui;
  local_29 = ((GImGui->NextWindowData).Flags & 0x10U) != 0;
  (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags & 0xffffffef;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_38 = GetCurrentWindow();
  if ((local_38->SkipItems & 1U) == 0) {
    local_40 = &local_28->Style;
    local_44 = ImGuiWindow::GetID((ImGuiWindow *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  (char *)in_stack_fffffffffffffe38,
                                  (char *)in_stack_fffffffffffffe30);
    if ((local_1c & 0x20) == 0) {
      local_174 = GetFrameHeight();
    }
    else {
      local_174 = 0.0;
    }
    local_48 = local_174;
    local_50 = CalcTextSize((char *)in_stack_fffffffffffffe48,
                            (char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                            SUB81((ulong)in_stack_fffffffffffffe38 >> 0x38,0),
                            SUB84(in_stack_fffffffffffffe38,0));
    local_54 = CalcItemWidth();
    local_178 = local_54;
    if ((local_1c & 0x40) != 0) {
      local_178 = local_48;
    }
    local_58 = local_178;
    pos_00 = (ImVec2)&local_38->DC;
    fVar3 = (local_40->FramePadding).y;
    bb = &local_78;
    ImVec2::ImVec2(&bb->Min,local_178,fVar3 + fVar3 + local_50.y);
    local_78.Max = ::operator+(&in_stack_fffffffffffffe18->Min,(ImVec2 *)0x2058da);
    ImRect::ImRect(&local_68,(ImVec2 *)pos_00,&local_78.Max);
    p_max = (ImVec2)&local_68;
    p_min = (ImVec2)&local_68.Max;
    if (local_50.x <= 0.0) {
      fVar3 = 0.0;
    }
    else {
      fVar3 = (local_40->ItemInnerSpacing).x + local_50.x;
    }
    this = &local_98;
    ImVec2::ImVec2(this,fVar3,0.0);
    local_90 = ::operator+(&in_stack_fffffffffffffe18->Min,(ImVec2 *)0x20597f);
    ImRect::ImRect(&local_88,(ImVec2 *)p_max,&local_90);
    ItemSize(in_stack_fffffffffffffe20,(float)((ulong)in_stack_fffffffffffffe18 >> 0x20));
    bVar1 = ItemAdd((ImRect *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                    (ImRect *)in_stack_fffffffffffffe38);
    if (bVar1) {
      local_9b = ButtonBehavior(bb,(ImGuiID)fVar3,(bool *)this,(bool *)in_stack_fffffffffffffe50,
                                (ImGuiButtonFlags)((ulong)in_stack_fffffffffffffe48 >> 0x20));
      local_9c = IsPopupOpen((ImGuiID)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      local_a0 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                             SUB84(in_stack_fffffffffffffe30,0));
      local_a4 = ImMax<float>(local_68.Min.x,local_68.Max.x - local_48);
      RenderNavHighlight(in_stack_fffffffffffffed0,
                         (ImGuiID)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                         (ImGuiNavHighlightFlags)in_stack_fffffffffffffec8);
      if ((local_1c & 0x40) == 0) {
        in_stack_fffffffffffffe48 = local_38->DrawList;
        in_stack_fffffffffffffe50 = &local_68;
        ImVec2::ImVec2(&local_ac,local_a4,local_68.Max.y);
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   (ImVec2 *)in_stack_fffffffffffffe38,(ImVec2 *)in_stack_fffffffffffffe30,
                   (ImU32)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                   SUB84(in_stack_fffffffffffffe28,0),
                   (ImDrawCornerFlags)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      }
      if ((local_1c & 0x20) == 0) {
        uVar5 = (undefined3)in_stack_fffffffffffffe44;
        in_stack_fffffffffffffe44 = CONCAT13(1,uVar5);
        if ((local_9c & 1) == 0) {
          in_stack_fffffffffffffe44 = CONCAT13(local_99,uVar5);
        }
        local_b0 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                               SUB84(in_stack_fffffffffffffe30,0));
        local_b4 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                               SUB84(in_stack_fffffffffffffe30,0));
        in_stack_fffffffffffffe38 = local_38->DrawList;
        ImVec2::ImVec2(&local_bc,local_a4,local_68.Min.y);
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   (ImVec2 *)in_stack_fffffffffffffe38,(ImVec2 *)in_stack_fffffffffffffe30,
                   (ImU32)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                   SUB84(in_stack_fffffffffffffe28,0),
                   (ImDrawCornerFlags)((ulong)in_stack_fffffffffffffe20 >> 0x20));
        if ((local_a4 + local_48) - (local_40->FramePadding).x <= local_68.Max.x) {
          in_stack_fffffffffffffe30 = local_38->DrawList;
          fVar4 = (local_40->FramePadding).y;
          ImVec2::ImVec2(&local_c4,local_a4 + fVar4,local_68.Min.y + fVar4);
          RenderArrow(in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,
                      (ImU32)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                      (ImGuiDir)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
        }
      }
      RenderFrameBorder(p_min,p_max,pos_00.y);
      if ((local_18 != (ImGuiWindow *)0x0) && ((local_1c & 0x40) == 0)) {
        ::operator+(&in_stack_fffffffffffffe18->Min,(ImVec2 *)0x205d47);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff18,local_a4,local_68.Max.y);
        ImVec2::ImVec2(&local_f0,0.0,0.0);
        in_stack_fffffffffffffe18 = (ImRect *)0x0;
        RenderTextClipped((ImVec2 *)pos_00,&bb->Min,
                          (char *)CONCAT44(fVar3,in_stack_fffffffffffffe60),(char *)this,
                          &in_stack_fffffffffffffe50->Min,(ImVec2 *)in_stack_fffffffffffffe48,
                          (ImRect *)p_min);
        in_stack_fffffffffffffe28 = local_18;
      }
      idx = (ImGuiStyleVar)((ulong)in_stack_fffffffffffffe50 >> 0x20);
      hide_text_after_hash = (undefined1)((ulong)this >> 0x38);
      if (0.0 < local_50.x) {
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff08,
                       local_68.Max.x + (local_40->ItemInnerSpacing).x,
                       local_68.Min.y + (local_40->FramePadding).y);
        RenderText(pos_00,(char *)bb,(char *)CONCAT44(fVar3,in_stack_fffffffffffffe60),
                   (bool)hide_text_after_hash);
      }
      if ((((local_9b & 1) != 0) || (local_28->NavActivateId == local_44)) && ((local_9c & 1) == 0))
      {
        if ((local_38->DC).NavLayerCurrent == ImGuiNavLayer_Main) {
          local_38->NavLastIds[0] = local_44;
        }
        OpenPopupEx((ImGuiID)pos_00.y);
        local_9c = 1;
      }
      if ((local_9c & 1) == 0) {
        local_1 = false;
      }
      else {
        if ((local_29 & 1) == 0) {
          if ((local_1c & 0x1e) == 0) {
            local_1c = local_1c | 4;
          }
          in_stack_ffffffffffffff04 = -1;
          if ((local_1c & 4) == 0) {
            if ((local_1c & 2) == 0) {
              if ((local_1c & 8) != 0) {
                in_stack_ffffffffffffff04 = 0x14;
              }
            }
            else {
              in_stack_ffffffffffffff04 = 4;
            }
          }
          else {
            in_stack_ffffffffffffff04 = 8;
          }
          ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffefc,local_58,0.0);
          fVar4 = CalcMaxPopupHeightFromItemCount(in_stack_ffffffffffffff04);
          ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffef4,3.4028235e+38,fVar4);
          SetNextWindowSizeConstraints
                    ((ImVec2 *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                     (ImVec2 *)in_stack_fffffffffffffe38,
                     (ImGuiSizeCallback)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
          count = (int)((ulong)in_stack_fffffffffffffe30 >> 0x20);
        }
        else {
          (local_28->NextWindowData).Flags = (local_28->NextWindowData).Flags | 0x10;
          fVar4 = ImMax<float>((local_28->NextWindowData).SizeConstraintRect.Min.x,local_58);
          count = (int)((ulong)in_stack_fffffffffffffe30 >> 0x20);
          (local_28->NextWindowData).SizeConstraintRect.Min.x = fVar4;
        }
        ImFormatString(local_128,0x10,"##Combo_%02d",(ulong)(uint)(local_28->BeginPopupStack).Size);
        pIVar2 = FindWindowByName((char *)in_stack_fffffffffffffe20);
        if ((pIVar2 != (ImGuiWindow *)0x0) && ((pIVar2->WasActive & 1U) != 0)) {
          CalcWindowExpectedSize(in_stack_fffffffffffffe28);
          if ((local_1c & 1) != 0) {
            pIVar2->AutoPosLastDirection = 0;
          }
          local_148 = GetWindowAllowedExtentRect
                                ((ImGuiWindow *)CONCAT44(fVar3,in_stack_fffffffffffffe60));
          local_158 = ImRect::GetBL(in_stack_fffffffffffffe18);
          local_150 = FindBestWindowPosForPopupEx
                                ((ImVec2 *)in_stack_ffffffffffffff08,
                                 (ImVec2 *)
                                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                                 in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                                 in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
          ImVec2::ImVec2(&local_160,0.0,0.0);
          SetNextWindowPos(&local_150,0,&local_160);
        }
        local_164 = 0x4000147;
        ImVec2::ImVec2(&local_16c,(local_40->FramePadding).x,(local_40->WindowPadding).y);
        PushStyleVar(idx,(ImVec2 *)in_stack_fffffffffffffe48);
        bVar1 = Begin(in_stack_00000270,in_stack_00000268,in_stack_00000264);
        PopStyleVar(count);
        if (bVar1) {
          local_1 = true;
        }
        else {
          EndPopup();
          local_1 = false;
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    // Always consume the SetNextWindowSizeConstraint() call in our early return paths
    ImGuiContext& g = *GImGui;
    bool has_window_size_constraint = (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint) != 0;
    g.NextWindowData.Flags &= ~ImGuiNextWindowDataFlags_HasSizeConstraint;

    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float expected_w = CalcItemWidth();
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : expected_w;
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y*2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(frame_bb, id, &hovered, &held);
    bool popup_open = IsPopupOpen(id);

    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    const float value_x2 = ImMax(frame_bb.Min.x, frame_bb.Max.x - arrow_size);
    RenderNavHighlight(frame_bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(frame_bb.Min, ImVec2(value_x2, frame_bb.Max.y), frame_col, style.FrameRounding, (flags & ImGuiComboFlags_NoArrowButton) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Left);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        ImU32 bg_col = GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
        ImU32 text_col = GetColorU32(ImGuiCol_Text);
        window->DrawList->AddRectFilled(ImVec2(value_x2, frame_bb.Min.y), frame_bb.Max, bg_col, style.FrameRounding, (w <= arrow_size) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Right);
        if (value_x2 + arrow_size - style.FramePadding.x <= frame_bb.Max.x)
            RenderArrow(window->DrawList, ImVec2(value_x2 + style.FramePadding.y, frame_bb.Min.y + style.FramePadding.y), text_col, ImGuiDir_Down, 1.0f);
    }
    RenderFrameBorder(frame_bb.Min, frame_bb.Max, style.FrameRounding);
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
        RenderTextClipped(frame_bb.Min + style.FramePadding, ImVec2(value_x2, frame_bb.Max.y), preview_value, NULL, NULL, ImVec2(0.0f,0.0f));
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    if ((pressed || g.NavActivateId == id) && !popup_open)
    {
        if (window->DC.NavLayerCurrent == 0)
            window->NavLastIds[0] = id;
        OpenPopupEx(id);
        popup_open = true;
    }

    if (!popup_open)
        return false;

    if (has_window_size_constraint)
    {
        g.NextWindowData.Flags |= ImGuiNextWindowDataFlags_HasSizeConstraint;
        g.NextWindowData.SizeConstraintRect.Min.x = ImMax(g.NextWindowData.SizeConstraintRect.Min.x, w);
    }
    else
    {
        if ((flags & ImGuiComboFlags_HeightMask_) == 0)
            flags |= ImGuiComboFlags_HeightRegular;
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_));    // Only one
        int popup_max_height_in_items = -1;
        if (flags & ImGuiComboFlags_HeightRegular)     popup_max_height_in_items = 8;
        else if (flags & ImGuiComboFlags_HeightSmall)  popup_max_height_in_items = 4;
        else if (flags & ImGuiComboFlags_HeightLarge)  popup_max_height_in_items = 20;
        SetNextWindowSizeConstraints(ImVec2(w, 0.0f), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));
    }

    char name[16];
    ImFormatString(name, IM_ARRAYSIZE(name), "##Combo_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth

    // Peak into expected window size so we can position it
    if (ImGuiWindow* popup_window = FindWindowByName(name))
        if (popup_window->WasActive)
        {
            ImVec2 size_expected = CalcWindowExpectedSize(popup_window);
            if (flags & ImGuiComboFlags_PopupAlignLeft)
                popup_window->AutoPosLastDirection = ImGuiDir_Left;
            ImRect r_outer = GetWindowAllowedExtentRect(popup_window);
            ImVec2 pos = FindBestWindowPosForPopupEx(frame_bb.GetBL(), size_expected, &popup_window->AutoPosLastDirection, r_outer, frame_bb, ImGuiPopupPositionPolicy_ComboBox);
            SetNextWindowPos(pos);
        }

    // We don't use BeginPopupEx() solely because we have a custom name string, which we could make an argument to BeginPopupEx()
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoMove;

    // Horizontally align ourselves with the framed text
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(style.FramePadding.x, style.WindowPadding.y));
    bool ret = Begin(name, NULL, window_flags);
    PopStyleVar();
    if (!ret)
    {
        EndPopup();
        IM_ASSERT(0);   // This should never happen as we tested for IsPopupOpen() above
        return false;
    }
    return true;
}